

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O3

int archive_write_set_format_ustar(archive *_a)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_ustar");
  iVar3 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)(_a + 2) != (code *)0x0) {
      (**(code **)(_a + 2))(_a);
    }
    pvVar2 = calloc(1,0x28);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate ustar data");
    }
    else {
      *(void **)&_a[1].current_codepage = pvVar2;
      _a[1].sconv = (archive_string_conv *)0x5928e5;
      _a[1].read_data_offset = (int64_t)archive_write_ustar_options;
      _a[1].read_data_remaining = (size_t)archive_write_ustar_header;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_ustar_data;
      _a[1].read_data_requested = (size_t)archive_write_ustar_close;
      *(code **)(_a + 2) = archive_write_ustar_free;
      _a[1].read_data_output_offset = (int64_t)archive_write_ustar_finish_entry;
      _a->archive_format = 0x30001;
      _a->archive_format_name = "POSIX ustar";
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_set_format_ustar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct ustar *ustar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_ustar");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	/* Basic internal sanity test. */
	if (sizeof(template_header) != 512) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal: template_header wrong size: %zu should be 512",
		    sizeof(template_header));
		return (ARCHIVE_FATAL);
	}

	ustar = (struct ustar *)calloc(1, sizeof(*ustar));
	if (ustar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = ustar;
	a->format_name = "ustar";
	a->format_options = archive_write_ustar_options;
	a->format_write_header = archive_write_ustar_header;
	a->format_write_data = archive_write_ustar_data;
	a->format_close = archive_write_ustar_close;
	a->format_free = archive_write_ustar_free;
	a->format_finish_entry = archive_write_ustar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
	a->archive.archive_format_name = "POSIX ustar";
	return (ARCHIVE_OK);
}